

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder *pDecoder,ma_uint64 *pLength)

{
  ma_result mVar1;
  ma_uint32 internalSampleRate;
  ma_uint64 internalLengthInPCMFrames;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pDecoder != (ma_decoder *)0x0)) {
    if (pDecoder->pBackend == (ma_data_source *)0x0) {
      mVar1 = MA_NO_BACKEND;
    }
    else {
      mVar1 = ma_data_source_get_length_in_pcm_frames(pDecoder->pBackend,&internalLengthInPCMFrames)
      ;
      if ((mVar1 == MA_SUCCESS) &&
         (mVar1 = ma_data_source_get_data_format
                            (pDecoder->pBackend,(ma_format *)0x0,(ma_uint32 *)0x0,
                             &internalSampleRate,(ma_channel *)0x0,0), mVar1 == MA_SUCCESS)) {
        if (internalSampleRate != pDecoder->outputSampleRate) {
          internalLengthInPCMFrames =
               ma_calculate_frame_count_after_resampling
                         (pDecoder->outputSampleRate,internalSampleRate,internalLengthInPCMFrames);
        }
        *pLength = internalLengthInPCMFrames;
        mVar1 = MA_SUCCESS;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder* pDecoder, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalLengthInPCMFrames;
        ma_uint32 internalSampleRate;

        result = ma_data_source_get_length_in_pcm_frames(pDecoder->pBackend, &internalLengthInPCMFrames);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal length. */
        }

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;   /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            *pLength = internalLengthInPCMFrames;
        } else {
            *pLength = ma_calculate_frame_count_after_resampling(pDecoder->outputSampleRate, internalSampleRate, internalLengthInPCMFrames);
        }

        return MA_SUCCESS;
    } else {
        return MA_NO_BACKEND;
    }
}